

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AcceptanceTests_Load_Test>::
~ParameterizedTestFactory
          (ParameterizedTestFactory<(anonymous_namespace)::AcceptanceTests_Load_Test> *this)

{
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_00195b50;
  anon_unknown.dwarf_d1b8::CcsTestCase::~CcsTestCase(&this->parameter_);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter) :
      parameter_(parameter) {}